

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.hpp
# Opt level: O3

XMLCh * __thiscall xercesc_4_0::TraverseSchema::getLocalPart(TraverseSchema *this,XMLCh *rawName)

{
  XMLBuffer *this_00;
  short *psVar1;
  XMLStringPool *pXVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  XMLSize_t count;
  
  iVar3 = XMLString::indexOf(rawName,L':');
  count = 0;
  if (rawName != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)rawName + count);
      count = count + 2;
    } while (*psVar1 != 0);
    count = ((long)count >> 1) - 1;
  }
  if (count == (long)(iVar3 + 1)) {
    return L"";
  }
  this_00 = &this->fBuffer;
  if (iVar3 == -1) {
    this_00->fIndex = 0;
  }
  else {
    rawName = rawName + (long)iVar3 + 1;
    count = count + ~(long)iVar3;
    this_00->fIndex = 0;
  }
  XMLBuffer::append(this_00,rawName,count);
  pXVar2 = this->fStringPool;
  (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
  uVar4 = (*(pXVar2->super_XSerializable)._vptr_XSerializable[5])(pXVar2);
  iVar3 = (*(pXVar2->super_XSerializable)._vptr_XSerializable[10])(pXVar2,(ulong)uVar4);
  return (XMLCh *)CONCAT44(extraout_var,iVar3);
}

Assistant:

inline const XMLCh* TraverseSchema::getLocalPart(const XMLCh* const rawName) {

    int    colonIndex = XMLString::indexOf(rawName, chColon);
    XMLSize_t rawNameLen = XMLString::stringLen(rawName);

    if (XMLSize_t(colonIndex + 1) == rawNameLen) {
        return XMLUni::fgZeroLenString;
    }

    if (colonIndex == -1) {
        fBuffer.set(rawName, rawNameLen);
    }
    else {

        fBuffer.set(rawName + colonIndex + 1, rawNameLen - colonIndex - 1);
    }

    return fStringPool->getValueForId(fStringPool->addOrFind(fBuffer.getRawBuffer()));
}